

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall stringToUnits_invalid_Test::TestBody(stringToUnits_invalid_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  char *in_R9;
  precise_unit pVar4;
  string local_628;
  AssertHelper local_608;
  Message local_600;
  allocator local_5f1;
  string local_5f0;
  precise_unit local_5d0;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_588;
  Message local_580;
  allocator local_571;
  string local_570;
  precise_unit local_550;
  bool local_539;
  undefined1 local_538 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_508;
  Message local_500;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__9;
  string local_4d8;
  double local_4b8;
  double dStack_4b0;
  string local_4a8;
  AssertHelper local_488;
  Message local_480;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__8;
  string local_458;
  double local_438;
  double dStack_430;
  string local_428;
  AssertHelper local_408;
  Message local_400;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__7;
  string local_3d8;
  double local_3b8;
  double dStack_3b0;
  string local_3a8;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar__6;
  string local_358;
  double local_338;
  double dStack_330;
  string local_328;
  AssertHelper local_308;
  Message local_300;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__5;
  string local_2d8;
  double local_2b8;
  double dStack_2b0;
  string local_2a8;
  AssertHelper local_288;
  Message local_280;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar__4;
  string local_258;
  double local_238;
  double dStack_230;
  string local_228;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__3;
  string local_1d8;
  double local_1b8;
  double dStack_1b0;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__2;
  string local_158;
  undefined1 auStack_138 [8];
  precise_unit u2;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  allocator local_e9;
  string local_e8;
  precise_unit local_c8;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_80;
  Message local_78;
  bool local_69;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  precise_unit u1;
  stringToUnits_invalid_Test *this_local;
  
  u1._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"{(test}",&local_41);
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_40,uVar2);
  u1.multiplier_ = pVar4._8_8_;
  local_20 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_69 = units::is_error((precise_unit *)local_20);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_68,&local_69,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_68,
               (AssertionResult *)"is_error(u1)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x454,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"{\\(test}",&local_e9);
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_e8,uVar2);
  local_c8._8_8_ = pVar4._8_8_;
  local_c8.multiplier_ = pVar4.multiplier_;
  bVar1 = units::is_error(&local_c8);
  local_b1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b0,&local_b1,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)local_b0,
               (AssertionResult *)"is_error(unit_from_string(\"{\\\\(test}\"))","true","false",in_R9
              );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x455,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_158,"cubed",
             (allocator *)
             ((long)&gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_158,uVar2);
  u2.multiplier_ = pVar4._8_8_;
  auStack_138 = (undefined1  [8])pVar4.multiplier_;
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_171 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)local_170,(AssertionResult *)"is_error(u2)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x458,pcVar3);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d8,"tothethirdpower",
             (allocator *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_1d8,uVar2);
  dStack_1b0 = pVar4._8_8_;
  local_1b8 = pVar4.multiplier_;
  auStack_138 = (undefined1  [8])local_1b8;
  u2.multiplier_ = dStack_1b0;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_1f1 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_228,(internal *)local_1f0,(AssertionResult *)"is_error(u2)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x45b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_258,"cubic",
             (allocator *)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_258,uVar2);
  dStack_230 = pVar4._8_8_;
  local_238 = pVar4.multiplier_;
  auStack_138 = (undefined1  [8])local_238;
  u2.multiplier_ = dStack_230;
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_271 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_270,&local_271,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2a8,(internal *)local_270,(AssertionResult *)"is_error(u2)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x45e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2d8,"m^-t",
             (allocator *)
             ((long)&gtest_ar__5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_2d8,uVar2);
  dStack_2b0 = pVar4._8_8_;
  local_2b8 = pVar4.multiplier_;
  auStack_138 = (undefined1  [8])local_2b8;
  u2.multiplier_ = dStack_2b0;
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__5.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_2f1 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_328,(internal *)local_2f0,(AssertionResult *)"is_error(u2)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x461,pcVar3);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_358,"m^4^-4",
             (allocator *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_358,uVar2);
  dStack_330 = pVar4._8_8_;
  local_338 = pVar4.multiplier_;
  auStack_138 = (undefined1  [8])local_338;
  u2.multiplier_ = dStack_330;
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__6.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_371 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3a8,(internal *)local_370,(AssertionResult *)"is_error(u2)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x463,pcVar3);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3d8,"m^(4)^-4",
             (allocator *)
             ((long)&gtest_ar__7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_3d8,uVar2);
  dStack_3b0 = pVar4._8_8_;
  local_3b8 = pVar4.multiplier_;
  auStack_138 = (undefined1  [8])local_3b8;
  u2.multiplier_ = dStack_3b0;
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__7.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_3f1 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_428,(internal *)local_3f0,(AssertionResult *)"is_error(u2)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x465,pcVar3);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_458,"m^-4^4",
             (allocator *)
             ((long)&gtest_ar__8.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_458,uVar2);
  dStack_430 = pVar4._8_8_;
  local_438 = pVar4.multiplier_;
  auStack_138 = (undefined1  [8])local_438;
  u2.multiplier_ = dStack_430;
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__8.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_471 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_470,&local_471,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4a8,(internal *)local_470,(AssertionResult *)"is_error(u2)","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x467,pcVar3);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4d8,"m^(-4)^4",
             (allocator *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_4d8,uVar2);
  dStack_4b0 = pVar4._8_8_;
  local_4b8 = pVar4.multiplier_;
  auStack_138 = (undefined1  [8])local_4b8;
  u2.multiplier_ = dStack_4b0;
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_4f1 = units::is_error((precise_unit *)auStack_138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_4f0,
               (AssertionResult *)"is_error(u2)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x46a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_570,"liquid",&local_571);
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_570,uVar2);
  local_550._8_8_ = pVar4._8_8_;
  local_550.multiplier_ = pVar4.multiplier_;
  bVar1 = units::is_valid(&local_550);
  local_539 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_538,&local_539,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_538,
               (AssertionResult *)"units::is_valid(unit_from_string(\"liquid\"))","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x46c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0,"_liquid_()",&local_5f1);
  uVar2 = units::getDefaultFlags();
  pVar4 = units::unit_from_string(&local_5f0,uVar2);
  local_5d0._8_8_ = pVar4._8_8_;
  local_5d0.multiplier_ = pVar4.multiplier_;
  bVar1 = units::is_valid(&local_5d0);
  local_5b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_628,(internal *)local_5b8,
               (AssertionResult *)"is_valid(unit_from_string(\"_liquid_()\"))","true","false",in_R9)
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x46d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string((string *)&local_628);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b8);
  return;
}

Assistant:

TEST(stringToUnits, invalid)
{
    auto u1 = unit_from_string("{(test}");
    EXPECT_TRUE(is_error(u1));
    EXPECT_FALSE(is_error(unit_from_string("{\\(test}")));

    auto u2 = unit_from_string("cubed");
    EXPECT_TRUE(is_error(u2));

    u2 = unit_from_string("tothethirdpower");
    EXPECT_TRUE(is_error(u2));

    u2 = unit_from_string("cubic");
    EXPECT_TRUE(is_error(u2));

    u2 = unit_from_string("m^-t");
    EXPECT_TRUE(is_error(u2));
    u2 = unit_from_string("m^4^-4");
    EXPECT_TRUE(is_error(u2));
    u2 = unit_from_string("m^(4)^-4");
    EXPECT_TRUE(is_error(u2));
    u2 = unit_from_string("m^-4^4");
    EXPECT_TRUE(is_error(u2));

    u2 = unit_from_string("m^(-4)^4");
    EXPECT_TRUE(is_error(u2));

    EXPECT_FALSE(units::is_valid(unit_from_string("liquid")));
    EXPECT_FALSE(is_valid(unit_from_string("_liquid_()")));
}